

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

int __thiscall transwarp::detail::thread_pool::shutdown(thread_pool *this,int __fd,int __how)

{
  pointer ptVar1;
  int extraout_EAX;
  thread *thread;
  pointer ptVar2;
  
  std::mutex::lock(&this->mutex_);
  this->done_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  std::condition_variable::notify_all();
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::clear(&this->threads_);
  return extraout_EAX;
}

Assistant:

void shutdown() {
        {
            std::lock_guard<std::mutex> lock(mutex_);
            done_ = true;
        }
        cond_var_.notify_all();
        for (std::thread& thread : threads_) {
            thread.join();
        }
        threads_.clear();
    }